

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blech32.c
# Opt level: O0

int wally_confidential_addr_from_addr_segwit
              (char *address,char *addr_family,char *confidential_addr_family,uchar *pub_key,
              size_t pub_key_len,char **output)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  int local_49c;
  size_t sStack_498;
  int ret;
  size_t written;
  uchar *hash_bytes_p;
  uchar buf [65];
  char local_438 [8];
  char result [1001];
  char **output_local;
  size_t pub_key_len_local;
  uchar *pub_key_local;
  char *confidential_addr_family_local;
  char *addr_family_local;
  char *address_local;
  
  written = (size_t)(buf + 0x17);
  sStack_498 = 0x22;
  if (output != (char **)0x0) {
    *output = (char *)0x0;
  }
  if (((((address == (char *)0x0) || (addr_family == (char *)0x0)) ||
       (confidential_addr_family == (char *)0x0)) ||
      ((pub_key == (uchar *)0x0 || (pub_key_len != 0x21)))) ||
     ((output == (char **)0x0 || (sVar2 = strlen(confidential_addr_family), 999 < sVar2)))) {
    address_local._4_4_ = -2;
  }
  else {
    local_49c = wally_addr_segwit_to_bytes
                          (address,addr_family,0,(uchar *)written,sStack_498,
                           &stack0xfffffffffffffb68);
    if (local_49c == 0) {
      if ((sStack_498 == 0x16) || (sStack_498 == 0x22)) {
        memcpy(&hash_bytes_p,pub_key,0x21);
        sStack_498 = sStack_498 + 0x1f;
        iVar1 = blech32_addr_encode(local_438,confidential_addr_family,0,(uint8_t *)&hash_bytes_p,
                                    sStack_498);
        if (iVar1 == 0) {
          return -1;
        }
        pcVar3 = wally_strdup(local_438);
        *output = pcVar3;
        local_49c = -3;
        if (*output != (char *)0x0) {
          local_49c = 0;
        }
      }
      else {
        local_49c = -2;
      }
    }
    wally_clear(&hash_bytes_p,0x41);
    wally_clear(local_438,0x3e9);
    address_local._4_4_ = local_49c;
  }
  return address_local._4_4_;
}

Assistant:

int wally_confidential_addr_from_addr_segwit(
    const char *address,
    const char *addr_family,
    const char *confidential_addr_family,
    const unsigned char *pub_key,
    size_t pub_key_len,
    char **output)
{
    char result[WALLY_BLECH32_MAXLEN + 1];
    unsigned char buf[EC_PUBLIC_KEY_LEN + SHA256_LEN];
    unsigned char *hash_bytes_p = &buf[EC_PUBLIC_KEY_LEN - 2];
    size_t written = SHA256_LEN + 2;
    int ret;

    if (output)
        *output = NULL;

    if (!address || !addr_family || !confidential_addr_family || !pub_key ||
        pub_key_len != EC_PUBLIC_KEY_LEN || !output ||
        strlen(confidential_addr_family) >= WALLY_BLECH32_MAXLEN)
        return WALLY_EINVAL;

    /* get v0 witness programs script */
    ret = wally_addr_segwit_to_bytes(address, addr_family, 0,
                                     hash_bytes_p, written, &written);
    if (ret == WALLY_OK) {
        if ((written != (HASH160_LEN + 2)) && (written != (SHA256_LEN + 2)))
            ret = WALLY_EINVAL;
        else {
            /* Copy the confidentialKey / v0 witness programs */
            memcpy(buf, pub_key, pub_key_len);
            written -= 2;   /* ignore witnessVersion & hashSize */
            written += EC_PUBLIC_KEY_LEN;
            if (!blech32_addr_encode(result, confidential_addr_family, 0, buf, written))
                return WALLY_ERROR;

            *output = wally_strdup(result);
            ret = (*output) ? WALLY_OK : WALLY_ENOMEM;
        }
    }

    wally_clear(buf, sizeof(buf));
    wally_clear(result, sizeof(result));
    return ret;
}